

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O2

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_2367b4::CAPIBuildEngineDelegate::lookupRule
          (CAPIBuildEngineDelegate *this,KeyType *key)

{
  _func_int **pp_Var1;
  Rule *this_00;
  KeyType *in_RDX;
  llb_data_t key_data;
  
  this_00 = (Rule *)operator_new(0x68);
  key_data.length = 0;
  llbuild::core::Rule::Rule(this_00,in_RDX,(CommandSignature *)&key_data);
  this_00->_vptr_Rule = (_func_int **)&PTR__Rule_0022c460;
  pp_Var1 = (_func_int **)(key->key).field_2._M_allocated_capacity;
  this_00[2]._vptr_Rule = pp_Var1;
  key_data.length = (in_RDX->key)._M_string_length;
  key_data.data = (uint8_t *)(in_RDX->key)._M_dataplus._M_p;
  (*(code *)key[1].key._M_dataplus._M_p)(pp_Var1,&key_data,this_00 + 1);
  if (this_00[1].key.key.field_2._M_allocated_capacity != 0) {
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)this_00;
    return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
            )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
              )this;
  }
  __assert_fail("capiRule->rule.create_task && \"client failed to initialize rule\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                ,0x4d,
                "virtual std::unique_ptr<Rule> (anonymous namespace)::CAPIBuildEngineDelegate::lookupRule(const KeyType &)"
               );
}

Assistant:

virtual std::unique_ptr<Rule> lookupRule(const KeyType& key) override {
    CAPIRule* capiRule = new CAPIRule(key);
    capiRule->engineContext = cAPIDelegate.context;
    llb_data_t key_data{ key.size(), (const uint8_t*)key.data() };
    cAPIDelegate.lookup_rule(cAPIDelegate.context, &key_data, &capiRule->rule);

    // FIXME: Check that the client created the rule appropriately. We should
    // change the API to be type safe here, by forcing the client to return a
    // handle created by the C API.
    assert(capiRule->rule.create_task && "client failed to initialize rule");

    return std::unique_ptr<Rule>(capiRule);
  }